

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner_impl.hpp
# Opt level: O1

string * __thiscall
toml::detail::sequence::expected_chars_abi_cxx11_
          (string *__return_storage_ptr__,sequence *this,location *loc)

{
  pointer psVar1;
  _Head_base<0UL,_toml::detail::scanner_base_*,_false> _Var2;
  pointer psVar3;
  location first;
  region reg;
  location lStack_d8;
  region local_90;
  
  location::location(&lStack_d8,loc);
  psVar3 = (this->others_).
           super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (this->others_).
           super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar3 != psVar1) {
    do {
      _Var2._M_head_impl =
           (psVar3->scanner_)._M_t.
           super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
           ._M_t.
           super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
           .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl;
      (*(_Var2._M_head_impl)->_vptr_scanner_base[2])(&local_90,_Var2._M_head_impl,loc);
      if (local_90.source_.
          super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr == (element_type *)0x0) {
        _Var2._M_head_impl =
             (psVar3->scanner_)._M_t.
             super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
             ._M_t.
             super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
             .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl;
        (*(_Var2._M_head_impl)->_vptr_scanner_base[4])
                  (__return_storage_ptr__,_Var2._M_head_impl,loc);
        region::~region(&local_90);
        goto LAB_0035c410;
      }
      region::~region(&local_90);
      psVar3 = psVar3 + 1;
    } while (psVar3 != psVar1);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
LAB_0035c410:
  location::~location(&lStack_d8);
  return __return_storage_ptr__;
}

Assistant:

TOML11_INLINE std::string sequence::expected_chars(location& loc) const
{
    const auto first = loc;
    for(const auto& other : others_)
    {
        const auto reg = other.scan(loc);
        if( ! reg.is_ok())
        {
            return other.expected_chars(loc);
        }
    }
    assert(false);
    return ""; // XXX
}